

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_indexed_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_598a4::
CpuAbsoluteIndexedTest_isb_absy_no_carry_or_overflow_with_pagecrossing_Test::TestBody
          (CpuAbsoluteIndexedTest_isb_absy_no_carry_or_overflow_with_pagecrossing_Test *this)

{
  CpuAbsoluteIndexedTest_isb_absy_no_carry_or_overflow_with_pagecrossing_Test *this_local;
  
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.registers.a = 0xd0;
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.registers.p = 'A';
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.expected.p = 0x80;
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.expected.a = 0xe0;
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.field_0x114 = 0xef;
  CpuAbsoluteIndexedTest::run_readwrite_instruction_with_pagecrossing
            (&this->super_CpuAbsoluteIndexedTest,0xfb,Y,0xf0);
  return;
}

Assistant:

TEST_F(CpuAbsoluteIndexedTest,
        isb_absy_no_carry_or_overflow_with_pagecrossing) {
    registers.a = 0xD0;
    registers.p = V_FLAG | C_FLAG;
    expected.p = N_FLAG;
    expected.a = 0xE0;
    memory_content = 0xF0 - 0x01;

    run_readwrite_instruction_with_pagecrossing(ISB_ABSY, IndexReg::Y, 0xF0);
}